

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O3

ui32_t __thiscall
ASDCP::MXF::SimpleArray<ASDCP::MXF::RIP::PartitionPair>::ArchiveLength
          (SimpleArray<ASDCP::MXF::RIP::PartitionPair> *this)

{
  int iVar1;
  ui32_t uVar2;
  _List_node_base *p_Var3;
  
  uVar2 = 0;
  for (p_Var3 = (this->
                super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                ).
                super__List_base<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var3 != (_List_node_base *)
                &this->
                 super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
      ; p_Var3 = p_Var3->_M_next) {
    iVar1 = (*(code *)*(_List_node_base **)((long)(p_Var3[1]._M_next + 1) + 8))(p_Var3 + 1);
    uVar2 = uVar2 + iVar1;
  }
  return uVar2;
}

Assistant:

ui32_t ArchiveLength() const {
	    ui32_t arch_size = 0;

	    typename std::list<T>::const_iterator l_i = this->begin();

	    for ( ; l_i != this->end(); l_i++ )
	      arch_size += l_i->ArchiveLength();
	    
	    return arch_size;
	  }